

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_print(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val1;
  undefined1 auVar1 [16];
  int in_ECX;
  size_t len;
  char *str;
  int i;
  size_t *in_stack_ffffffffffffffa8;
  JSContext *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  undefined4 uStack_c;
  undefined8 local_8;
  
  iVar2 = 0;
  do {
    if (in_ECX <= iVar2) {
      putchar(10);
      local_8 = 3;
LAB_0010dc12:
      auVar1._4_8_ = local_8;
      auVar1._0_4_ = uStack_c;
      auVar1._12_4_ = 0;
      return (JSValue)(auVar1 << 0x20);
    }
    if (iVar2 != 0) {
      putchar(0x20);
    }
    val1.tag._0_4_ = in_stack_ffffffffffffffc0;
    val1.u = (JSValueUnion)in_stack_ffffffffffffffb8;
    val1.tag._4_4_ = iVar2;
    in_stack_ffffffffffffffb8 =
         JS_ToCStringLen(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,val1);
    if (in_stack_ffffffffffffffb8 == (char *)0x0) {
      local_8 = 6;
      goto LAB_0010dc12;
    }
    fwrite(in_stack_ffffffffffffffb8,1,(size_t)in_stack_ffffffffffffffb0,_stdout);
    JS_FreeCString((JSContext *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8)
    ;
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

static JSValue js_print(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    int i;
    const char *str;
    size_t len;

    for(i = 0; i < argc; i++) {
        if (i != 0)
            putchar(' ');
        str = JS_ToCStringLen(ctx, &len, argv[i]);
        if (!str)
            return JS_EXCEPTION;
        fwrite(str, 1, len, stdout);
        JS_FreeCString(ctx, str);
    }
    putchar('\n');
    return JS_UNDEFINED;
}